

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void ecs_gauge_reduce(ecs_gauge_t *dst,int32_t t_dst,ecs_gauge_t *src,int32_t t_src)

{
  bool bVar1;
  int iVar2;
  int local_2c;
  int32_t t;
  int32_t i;
  _Bool min_set;
  int32_t t_src_local;
  ecs_gauge_t *src_local;
  int32_t t_dst_local;
  ecs_gauge_t *dst_local;
  
  bVar1 = false;
  dst->min[t_dst] = 0.0;
  dst->avg[t_dst] = 0.0;
  dst->max[t_dst] = 0.0;
  for (local_2c = 0; local_2c < 0x3c; local_2c = local_2c + 1) {
    iVar2 = (t_src + local_2c) % 0x3c;
    dst->avg[t_dst] = src->avg[iVar2] / 60.0 + dst->avg[t_dst];
    if ((!bVar1) || (src->min[iVar2] < dst->min[t_dst])) {
      dst->min[t_dst] = src->min[iVar2];
      bVar1 = true;
    }
    if (dst->max[t_dst] <= src->max[iVar2] && src->max[iVar2] != dst->max[t_dst]) {
      dst->max[t_dst] = src->max[iVar2];
    }
  }
  return;
}

Assistant:

void ecs_gauge_reduce(
    ecs_gauge_t *dst,
    int32_t t_dst,
    ecs_gauge_t *src,
    int32_t t_src)
{
    bool min_set = false;
    dst->min[t_dst] = 0;
    dst->avg[t_dst] = 0;
    dst->max[t_dst] = 0;

    int32_t i;
    for (i = 0; i < ECS_STAT_WINDOW; i ++) {
        int32_t t = (t_src + i) % ECS_STAT_WINDOW;
        dst->avg[t_dst] += src->avg[t] / (float)ECS_STAT_WINDOW;
        if (!min_set || (src->min[t] < dst->min[t_dst])) {
            dst->min[t_dst] = src->min[t];
            min_set = true;
        }
        if ((src->max[t] > dst->max[t_dst])) {
            dst->max[t_dst] = src->max[t];
        }
    }
}